

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED.h
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GED::GED(GED *this,GED *param_1)

{
  GED *param_1_local;
  GED *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__GED_00330b70;
  return;
}

Assistant:

class KDIS_EXPORT GED : public DataTypeBase
{
public:

    GED() {};

    virtual ~GED() {};

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED::GetGroupedEntityCategory
    // Description: Identifies the derived GED class.
    //              Not part of the DIS PDU.
    //************************************
    virtual KDIS::DATA_TYPE::ENUMS::GroupedEntityCategory GetGroupedEntityCategory() const = 0;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED::GetLength
    // Description: Returns size of the GED in octets.
    //              Not part of the DIS PDU.
    //************************************
    virtual KUINT8 GetLength() const = 0;
}